

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O0

void __thiscall
chrono::ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed>::LoadIntLoadResidual_Mv
          (ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed> *this,ChVectorDynamic<> *R,
          ChVectorDynamic<> *w,double c)

{
  double dVar1;
  Scalar SVar2;
  undefined4 uVar3;
  Index IVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  element_type *peVar8;
  CoeffReturnType pdVar9;
  Scalar *pSVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 local_180 [28];
  uint row_1;
  int local_154;
  undefined1 local_150 [4];
  uint moffset_1;
  undefined1 local_140 [24];
  undefined1 local_128 [4];
  int i_1;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_f8;
  undefined1 local_c0 [28];
  uint row;
  int local_94;
  undefined1 local_90 [4];
  uint moffset;
  undefined1 local_80 [28];
  int i;
  uint rowQ;
  int local_54;
  undefined1 local_50 [8];
  ChVectorDynamic<> grouped_cMv;
  undefined1 local_38 [8];
  ChVectorDynamic<> grouped_w;
  double c_local;
  ChVectorDynamic<> *w_local;
  ChVectorDynamic<> *R_local;
  ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed> *this_local;
  
  if (*(long *)&this->field_0x38 != 0) {
    grouped_w.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)c;
    grouped_cMv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
    _4_4_ = (**(code **)(*(long *)this + 0x38))();
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_38,
               (int *)((long)&grouped_cMv.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows + 4));
    local_54 = (**(code **)(*(long *)this + 0x38))();
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_50,&local_54);
    local_80._24_4_ = 0;
    local_80._20_4_ = 0;
    while( true ) {
      uVar3 = local_80._20_4_;
      ChLoaderU::GetLoadable((ChLoaderU *)local_80);
      peVar8 = std::
               __shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_80);
      iVar6 = (**(code **)(*(long *)peVar8 + 0x40))();
      std::shared_ptr<chrono::ChLoadable>::~shared_ptr((shared_ptr<chrono::ChLoadable> *)local_80);
      if (iVar6 <= (int)uVar3) break;
      ChLoaderU::GetLoadable((ChLoaderU *)local_90);
      peVar8 = std::
               __shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_90);
      bVar5 = (**(code **)(*(long *)peVar8 + 0x58))(peVar8,local_80._20_4_);
      std::shared_ptr<chrono::ChLoadable>::~shared_ptr((shared_ptr<chrono::ChLoadable> *)local_90);
      if ((bVar5 & 1) != 0) {
        ChLoaderU::GetLoadable((ChLoaderU *)(local_c0 + 0x18));
        peVar8 = std::
                 __shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(local_c0 + 0x18));
        iVar6 = (**(code **)(*(long *)peVar8 + 0x48))(peVar8,local_80._20_4_);
        std::shared_ptr<chrono::ChLoadable>::~shared_ptr
                  ((shared_ptr<chrono::ChLoadable> *)(local_c0 + 0x18));
        local_c0._20_4_ = 0;
        local_94 = iVar6;
        while( true ) {
          uVar3 = local_c0._20_4_;
          ChLoaderU::GetLoadable((ChLoaderU *)local_c0);
          peVar8 = std::
                   __shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_c0);
          uVar7 = (**(code **)(*(long *)peVar8 + 0x50))(peVar8,local_80._20_4_);
          std::shared_ptr<chrono::ChLoadable>::~shared_ptr
                    ((shared_ptr<chrono::ChLoadable> *)local_c0);
          if (uVar7 <= (uint)uVar3) break;
          pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)w,
                              (ulong)(uint)(local_c0._20_4_ + local_94));
          dVar1 = *pdVar9;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_38,(ulong)(uint)local_80._24_4_);
          *pSVar10 = dVar1;
          local_80._24_4_ = local_80._24_4_ + 1;
          local_c0._20_4_ = local_c0._20_4_ + 1;
        }
      }
      local_80._20_4_ = local_80._20_4_ + 1;
    }
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                      *)local_128,
                     (double *)
                     &grouped_w.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows,(StorageBaseType *)(*(long *)&this->field_0x38 + 0x68));
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,1,-1,-1>const>const,Eigen::Matrix<double,-1,-1,1,-1,-1>const>>
    ::operator*(&local_f8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>>
                 *)local_128,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_38);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)local_50,
               (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_f8);
    local_80._24_4_ = 0;
    local_140._20_4_ = 0;
    while( true ) {
      uVar3 = local_140._20_4_;
      ChLoaderU::GetLoadable((ChLoaderU *)local_140);
      peVar8 = std::
               __shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_140);
      iVar6 = (**(code **)(*(long *)peVar8 + 0x40))();
      std::shared_ptr<chrono::ChLoadable>::~shared_ptr((shared_ptr<chrono::ChLoadable> *)local_140);
      if (iVar6 <= (int)uVar3) break;
      ChLoaderU::GetLoadable((ChLoaderU *)local_150);
      peVar8 = std::
               __shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_150);
      bVar5 = (**(code **)(*(long *)peVar8 + 0x58))(peVar8,local_140._20_4_);
      std::shared_ptr<chrono::ChLoadable>::~shared_ptr((shared_ptr<chrono::ChLoadable> *)local_150);
      if ((bVar5 & 1) != 0) {
        ChLoaderU::GetLoadable((ChLoaderU *)(local_180 + 0x18));
        peVar8 = std::
                 __shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(local_180 + 0x18));
        iVar6 = (**(code **)(*(long *)peVar8 + 0x48))(peVar8,local_140._20_4_);
        std::shared_ptr<chrono::ChLoadable>::~shared_ptr
                  ((shared_ptr<chrono::ChLoadable> *)(local_180 + 0x18));
        local_180._20_4_ = 0;
        local_154 = iVar6;
        while( true ) {
          uVar3 = local_180._20_4_;
          ChLoaderU::GetLoadable((ChLoaderU *)local_180);
          peVar8 = std::
                   __shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_180);
          uVar7 = (**(code **)(*(long *)peVar8 + 0x50))(peVar8,local_140._20_4_);
          std::shared_ptr<chrono::ChLoadable>::~shared_ptr
                    ((shared_ptr<chrono::ChLoadable> *)local_180);
          if (uVar7 <= (uint)uVar3) break;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               local_50,(ulong)(uint)local_80._24_4_);
          IVar4 = grouped_w.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                  .m_rows;
          SVar2 = *pSVar10;
          pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                               (ulong)(uint)(local_180._20_4_ + local_154));
          auVar12._8_8_ = 0;
          auVar12._0_8_ = SVar2;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = IVar4;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = *pSVar10;
          auVar11 = vfmadd213sd_fma(auVar11,auVar12,auVar13);
          *pSVar10 = auVar11._0_8_;
          local_80._24_4_ = local_80._24_4_ + 1;
          local_180._20_4_ = local_180._20_4_ + 1;
        }
      }
      local_140._20_4_ = local_140._20_4_ + 1;
    }
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_50);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_38);
  }
  return;
}

Assistant:

inline void ChLoad<Tloader>::LoadIntLoadResidual_Mv(ChVectorDynamic<>& R, const ChVectorDynamic<>& w, double c) {
    if (!this->jacobians)
        return;
    // fetch w as a contiguous vector
    ChVectorDynamic<> grouped_w(this->LoadGet_ndof_w());
    ChVectorDynamic<> grouped_cMv(this->LoadGet_ndof_w());
    unsigned int rowQ = 0;
    for (int i = 0; i < this->loader.GetLoadable()->GetSubBlocks(); ++i) {
        if (this->loader.GetLoadable()->IsSubBlockActive(i)) {
            unsigned int moffset = this->loader.GetLoadable()->GetSubBlockOffset(i);
            for (unsigned int row = 0; row < this->loader.GetLoadable()->GetSubBlockSize(i); ++row) {
                grouped_w(rowQ) = w(row + moffset);
                ++rowQ;
            }
        }
    }
    // do computation R=c*M*v
    grouped_cMv = c * this->jacobians->M * grouped_w;
    rowQ = 0;
    for (int i = 0; i < this->loader.GetLoadable()->GetSubBlocks(); ++i) {
        if (this->loader.GetLoadable()->IsSubBlockActive(i)) {
            unsigned int moffset = this->loader.GetLoadable()->GetSubBlockOffset(i);
            for (unsigned int row = 0; row < this->loader.GetLoadable()->GetSubBlockSize(i); ++row) {
                R(row + moffset) += grouped_cMv(rowQ) * c;
                ++rowQ;
            }
        }
    }
}